

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  long lVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  void *pvVar14;
  undefined4 *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  long lVar20;
  int iVar21;
  undefined4 *puVar22;
  long lVar23;
  undefined4 *puVar24;
  void *local_a8;
  
  if (0 < batch) {
    iVar7 = max_kk * batch;
    pvVar4 = AT->data;
    iVar3 = AT->w;
    sVar5 = AT->elemsize;
    pvVar6 = A->data;
    uVar10 = (ulong)(uint)batch;
    lVar8 = (long)max_ii;
    lVar23 = (long)iVar7;
    lVar1 = lVar23 * 4;
    lVar2 = uVar10 * 4;
    lVar20 = 0;
    uVar11 = 0;
    local_a8 = pvVar6;
    do {
      puVar24 = (undefined4 *)((long)iVar3 * sVar5 * uVar11 + (long)pvVar4);
      if (max_ii < 8) {
        uVar9 = 0;
      }
      else {
        uVar12 = 0;
        lVar16 = lVar20;
        do {
          lVar13 = lVar16;
          iVar21 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar24 = *(undefined4 *)((long)pvVar6 + lVar13);
              puVar24[1] = *(undefined4 *)((long)pvVar6 + lVar13 + lVar23 * 4);
              puVar24[2] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 2) * 4);
              puVar24[3] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 3) * 4);
              puVar24[4] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 4) * 4);
              puVar24[5] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 5) * 4);
              puVar24[6] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 6) * 4);
              puVar24[7] = *(undefined4 *)((long)pvVar6 + lVar13 + (long)(iVar7 * 7) * 4);
              puVar24 = puVar24 + 8;
              iVar21 = iVar21 + -1;
              lVar13 = lVar13 + lVar2;
            } while (iVar21 != 0);
          }
          uVar9 = uVar12 + 8;
          lVar13 = uVar12 + 0xf;
          lVar16 = lVar16 + lVar23 * 0x20;
          uVar12 = uVar9;
        } while (lVar13 < lVar8);
      }
      if ((int)((uint)uVar9 | 3) < max_ii) {
        uVar17 = uVar9 & 0xffffffff;
        lVar13 = lVar1 * uVar17;
        uVar12 = uVar17;
        lVar16 = lVar20;
        do {
          lVar18 = lVar16;
          iVar21 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar24 = *(undefined4 *)((long)pvVar6 + lVar18 + lVar13);
              puVar24[1] = *(undefined4 *)((long)pvVar6 + lVar18 + (uVar17 * 4 + 4) * lVar23);
              puVar24[2] = *(undefined4 *)((long)pvVar6 + lVar18 + lVar13 + (long)(iVar7 * 2) * 4);
              puVar24[3] = *(undefined4 *)((long)pvVar6 + lVar18 + lVar13 + (long)(iVar7 * 3) * 4);
              puVar24 = puVar24 + 4;
              iVar21 = iVar21 + -1;
              lVar18 = lVar18 + lVar2;
            } while (iVar21 != 0);
          }
          uVar9 = uVar12 + 4;
          lVar18 = uVar12 + 7;
          lVar16 = lVar16 + lVar23 * 0x10;
          uVar12 = uVar9;
        } while (lVar18 < lVar8);
      }
      if ((int)((uint)uVar9 | 1) < max_ii) {
        uVar12 = uVar9 & 0xffffffff;
        pvVar19 = (void *)((uVar12 * 4 + 4) * lVar23 + (long)local_a8);
        pvVar14 = (void *)(lVar1 * uVar12 + (long)local_a8);
        do {
          if (0 < max_kk) {
            lVar16 = 0;
            iVar21 = max_kk;
            do {
              *puVar24 = *(undefined4 *)((long)pvVar14 + lVar16);
              puVar24[1] = *(undefined4 *)((long)pvVar19 + lVar16);
              puVar24 = puVar24 + 2;
              lVar16 = lVar16 + lVar2;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar9 = uVar12 + 2;
          lVar16 = uVar12 + 3;
          pvVar19 = (void *)((long)pvVar19 + lVar23 * 8);
          pvVar14 = (void *)((long)pvVar14 + lVar23 * 8);
          uVar12 = uVar9;
        } while (lVar16 < lVar8);
      }
      if ((int)uVar9 < max_ii) {
        lVar16 = (long)(int)uVar9;
        puVar15 = (undefined4 *)(lVar1 * lVar16 + (long)local_a8);
        do {
          puVar22 = puVar15;
          iVar21 = max_kk;
          if (0 < max_kk) {
            do {
              *puVar24 = *puVar22;
              puVar24 = puVar24 + 1;
              iVar21 = iVar21 + -1;
              puVar22 = puVar22 + uVar10;
            } while (iVar21 != 0);
          }
          lVar16 = lVar16 + 1;
          puVar15 = puVar15 + lVar23;
        } while (lVar16 != lVar8);
      }
      uVar11 = uVar11 + 1;
      lVar20 = lVar20 + 4;
      local_a8 = (void *)((long)local_a8 + 4);
    } while (uVar11 != uVar10);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}